

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkg_genc.cpp
# Opt level: O3

void writeObjectCode(char *filename,char *destdir,char *optEntryPoint,char *optMatchArch,
                    char *optFilename,char *outFilePath)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  File *pFVar4;
  FILE *__stream;
  char cVar5;
  char cVar6;
  uchar uVar7;
  UBool UVar8;
  int32_t iVar9;
  int iVar10;
  int length;
  Elf64_Shdr *pEVar11;
  size_t sVar12;
  FileStream *pFVar13;
  Elf64_Shdr *pEVar14;
  Elf64_Shdr *pathname;
  size_t sVar15;
  Elf64_Shdr *pEVar16;
  UNewDataMemory *pData;
  uint uVar17;
  Elf64_Shdr *extraout_RDX;
  long lVar18;
  uint32_t uVar19;
  Elf64_Shdr *unaff_RBX;
  char *pcVar20;
  Elf32_Shdr *pEVar21;
  ulong uVar22;
  Elf64_Shdr *pEVar23;
  Elf32_Sym *addr;
  UErrorCode *pUVar24;
  char cVar25;
  UErrorCode code;
  char *pcVar26;
  uint uVar27;
  Elf32_Sym *__dest;
  Elf64_Shdr *unaff_R14;
  char *pcVar28;
  char entry [96];
  char buffer [4096];
  UErrorCode UStack_114c;
  Elf64_Shdr *pEStack_1148;
  Elf64_Shdr *pEStack_1140;
  Elf64_Shdr *pEStack_1138;
  Elf64_Shdr *pEStack_1130;
  char *pcStack_1128;
  Elf64_Shdr *pEStack_1120;
  char *pcStack_1118;
  Elf64_Shdr *pEStack_1110;
  char *pcStack_1108;
  char *pcStack_1100;
  Elf64_Shdr *pEStack_10f8;
  FileStream *pFStack_10f0;
  Elf64_Sym *pEStack_10e8;
  Elf64_Shdr *pEStack_10e0;
  Elf64_Shdr *pEStack_10d8;
  Elf32_Shdr *pEStack_10d0;
  undefined5 uStack_10c0;
  char local_10bb;
  Elf32_Half local_10ba;
  Elf64_Sym *local_10b8;
  char *local_10b0;
  char *local_10a8;
  char *local_10a0;
  undefined1 local_1098 [5];
  undefined1 auStack_1093 [3];
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  undefined8 uStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  Elf64_Shdr local_1038 [64];
  
  local_1048 = 0;
  uStack_1040 = 0;
  local_1058 = 0;
  uStack_1050 = 0;
  local_1068 = 0;
  uStack_1060 = 0;
  local_1078 = 0;
  uStack_1070 = 0;
  local_1088 = 0;
  uStack_1080 = 0;
  _local_1098 = 0;
  uStack_1090 = 0;
  pcVar26 = outFilePath;
  local_10a8 = destdir;
  local_10a0 = optFilename;
  if (optMatchArch == (char *)0x0) {
    pcVar28 = (char *)0x1;
    pEStack_10d0 = (Elf32_Shdr *)0x1ebb19;
    printf("genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n",3,0x20);
    local_10ba = 3;
    local_10bb = '\x01';
    __dest = (Elf32_Sym *)outFilePath;
LAB_001ebb25:
    pEVar23 = (Elf64_Shdr *)0x375167;
    pEStack_10d0 = (Elf32_Shdr *)0x1ebb34;
    pEVar11 = (Elf64_Shdr *)T_FileStream_open(filename,"rb");
    pEVar21 = (Elf32_Shdr *)filename;
    if (pEVar11 == (Elf64_Shdr *)0x0) {
      pEStack_10d0 = (Elf32_Shdr *)0x1ebddb;
      writeObjectCode_cold_8();
LAB_001ebddb:
      pEStack_10d0 = (Elf32_Shdr *)0x1ebde8;
      writeObjectCode_cold_7();
LAB_001ebde8:
      pEStack_10d0 = (Elf32_Shdr *)0x1ebdf2;
      writeObjectCode_cold_5();
    }
    else {
      pEStack_10d0 = (Elf32_Shdr *)0x1ebb48;
      iVar9 = T_FileStream_size((FileStream *)pEVar11);
      local_10b8 = (Elf64_Sym *)CONCAT44(local_10b8._4_4_,iVar9);
      unaff_RBX = (Elf64_Shdr *)(local_1098 + 1);
      optFilename = ".o";
      pEStack_10d0 = (Elf32_Shdr *)0x1ebb7a;
      pcVar28 = (char *)unaff_RBX;
      pcVar26 = local_10a0;
      local_10b0 = filename;
      getOutFilename(filename,local_10a8,(char *)local_1038,(char *)unaff_RBX,".o",local_10a0);
      if ((Elf64_Sym *)__dest != (Elf64_Sym *)0x0) {
        pEStack_10d0 = (Elf32_Shdr *)0x1ebb8f;
        strcpy((char *)__dest,(char *)local_1038);
      }
      if (optEntryPoint != (char *)0x0) {
        pEStack_10d0 = (Elf32_Shdr *)0x1ebb9f;
        strcpy((char *)unaff_RBX,optEntryPoint);
        pEStack_10d0 = (Elf32_Shdr *)0x1ebba7;
        sVar12 = strlen((char *)unaff_RBX);
        builtin_strncpy((char *)((long)&unaff_RBX->sh_name + sVar12),"_dat",4);
        local_1098[sVar12 + 5] = 0;
      }
      pEStack_10d0 = (Elf32_Shdr *)0x1ebbbb;
      sVar12 = strlen((char *)unaff_RBX);
      if (0 < (int)(uint)sVar12) {
        pcVar28 = (char *)0x0;
        do {
          if (*(char *)((long)&((Elf64_Shdr *)pcVar28)->sh_name + (long)(local_1098 + 1)) == '-') {
            *(char *)((long)&((Elf64_Shdr *)pcVar28)->sh_name + (long)(local_1098 + 1)) = '_';
          }
          pcVar28 = (char *)((long)&((Elf64_Shdr *)pcVar28)->sh_name + 1);
        } while ((Elf64_Shdr *)(ulong)((uint)sVar12 & 0x7fffffff) != (Elf64_Shdr *)pcVar28);
      }
      pEVar23 = (Elf64_Shdr *)0x37561b;
      pEStack_10d0 = (Elf32_Shdr *)0x1ebbee;
      pFVar13 = T_FileStream_open((char *)local_1038,"wb");
      unaff_R14 = pEVar11;
      if (pFVar13 == (FileStream *)0x0) goto LAB_001ebddb;
      unaff_RBX = (Elf64_Shdr *)0x0;
      uVar7 = (optMatchArch == (char *)0x0) + '\x01';
      if (local_10bb == '\0') {
        writeObjectCode::header64.e_machine = local_10ba;
        uVar17 = (uint)writeObjectCode::sectionHeaders64[4].sh_offset & 0xf;
        pcVar28 = (char *)(ulong)uVar17;
        if ((writeObjectCode::sectionHeaders64[4].sh_offset & 0xf) != 0) {
          unaff_RBX = (Elf64_Shdr *)(ulong)(0x10 - uVar17);
          writeObjectCode::sectionHeaders64[4].sh_offset =
               (long)&unaff_RBX->sh_name + writeObjectCode::sectionHeaders64[4].sh_offset;
        }
        writeObjectCode::sectionHeaders64[4].sh_size = (Elf64_Xword)(int)(Elf32_Word)local_10b8;
        pEStack_10d0 = (Elf32_Shdr *)0x1ebcab;
        writeObjectCode::header64.e_ident[5] = uVar7;
        writeObjectCode::symbols64[1].st_size = writeObjectCode::sectionHeaders64[4].sh_size;
        T_FileStream_write(pFVar13,&writeObjectCode::header64,0x40);
        pEStack_10d0 = (Elf32_Shdr *)0x1ebcbb;
        T_FileStream_write(pFVar13,writeObjectCode::sectionHeaders64,0x140);
        iVar9 = 0x30;
        addr = (Elf32_Sym *)writeObjectCode::symbols64;
        __dest = (Elf32_Sym *)writeObjectCode::symbols64;
        optMatchArch = (char *)writeObjectCode::sectionHeaders64;
      }
      else {
        writeObjectCode::header32.e_machine = local_10ba;
        uVar17 = writeObjectCode::sectionHeaders32[4].sh_offset & 0xf;
        pcVar28 = (char *)(ulong)uVar17;
        if (uVar17 == 0) {
          unaff_RBX = (Elf64_Shdr *)0x0;
        }
        else {
          unaff_RBX = (Elf64_Shdr *)(ulong)(0x10 - uVar17);
          writeObjectCode::sectionHeaders32[4].sh_offset =
               writeObjectCode::sectionHeaders32[4].sh_offset + (0x10 - uVar17);
        }
        writeObjectCode::sectionHeaders32[4].sh_size = (Elf32_Word)local_10b8;
        pEVar21 = writeObjectCode::sectionHeaders32;
        writeObjectCode::symbols32[1].st_size = (Elf32_Word)local_10b8;
        __dest = writeObjectCode::symbols32;
        pEStack_10d0 = (Elf32_Shdr *)0x1ebcfc;
        writeObjectCode::header32.e_ident[5] = uVar7;
        T_FileStream_write(pFVar13,&writeObjectCode::header32,0x34);
        pEStack_10d0 = (Elf32_Shdr *)0x1ebd0c;
        T_FileStream_write(pFVar13,writeObjectCode::sectionHeaders32,200);
        addr = writeObjectCode::symbols32;
        iVar9 = 0x20;
      }
      pEStack_10d0 = (Elf32_Shdr *)0x1ebd1c;
      T_FileStream_write(pFVar13,addr,iVar9);
      pEStack_10d0 = (Elf32_Shdr *)0x1ebd30;
      T_FileStream_write(pFVar13,"",0x28);
      pEStack_10d0 = (Elf32_Shdr *)0x1ebd42;
      T_FileStream_write(pFVar13,local_1098,0x60);
      if ((int)unaff_RBX != 0) {
        pEStack_10d0 = (Elf32_Shdr *)0x1ebd57;
        T_FileStream_write(pFVar13,"",(int)unaff_RBX);
      }
      pEVar23 = local_1038;
      pEStack_10d0 = (Elf32_Shdr *)0x1ebd6c;
      iVar9 = T_FileStream_read((FileStream *)pEVar11,pEVar23,0x1000);
      if (iVar9 != 0) {
        unaff_RBX = local_1038;
        do {
          pEStack_10d0 = (Elf32_Shdr *)0x1ebd85;
          T_FileStream_write(pFVar13,unaff_RBX,iVar9);
          pEStack_10d0 = (Elf32_Shdr *)0x1ebd95;
          pEVar23 = unaff_RBX;
          iVar9 = T_FileStream_read((FileStream *)pEVar11,unaff_RBX,0x1000);
        } while (iVar9 != 0);
      }
      pEStack_10d0 = (Elf32_Shdr *)0x1ebda1;
      iVar10 = T_FileStream_error((FileStream *)pEVar11);
      optEntryPoint = (char *)pFVar13;
      if (iVar10 != 0) goto LAB_001ebde8;
      pEStack_10d0 = (Elf32_Shdr *)0x1ebdad;
      iVar10 = T_FileStream_error(pFVar13);
      if (iVar10 == 0) {
        pEStack_10d0 = (Elf32_Shdr *)0x1ebdb9;
        T_FileStream_close(pFVar13);
        pEStack_10d0 = (Elf32_Shdr *)0x1ebdc1;
        T_FileStream_close((FileStream *)pEVar11);
        return;
      }
    }
    pEStack_10d0 = (Elf32_Shdr *)0x1ebdfc;
    writeObjectCode_cold_6();
    filename = (char *)pEVar21;
    outFilePath = (char *)__dest;
LAB_001ebdfc:
    pEStack_10d0 = (Elf32_Shdr *)0x1ebe04;
    writeObjectCode_cold_4();
LAB_001ebe04:
    pEStack_10d0 = (Elf32_Shdr *)0x1ebe0c;
    writeObjectCode_cold_3();
LAB_001ebe0c:
    pEStack_10d0 = (Elf32_Shdr *)0x1ebe14;
    pEVar14 = (Elf64_Shdr *)optMatchArch;
    writeObjectCode_cold_2();
  }
  else {
    pEVar23 = (Elf64_Shdr *)0x375167;
    pEStack_10d0 = (Elf32_Shdr *)0x1eba4f;
    pcVar28 = optMatchArch;
    pEVar11 = (Elf64_Shdr *)T_FileStream_open(optMatchArch,"rb");
    if (pEVar11 == (Elf64_Shdr *)0x0) goto LAB_001ebdfc;
    pEVar23 = local_1038;
    pEStack_10d0 = (Elf32_Shdr *)0x1eba70;
    pEVar14 = pEVar11;
    iVar9 = T_FileStream_read((FileStream *)pEVar11,pEVar23,0x800);
    unaff_R14 = pEVar11;
    if (iVar9 < 0x34) goto LAB_001ebe04;
    local_10b8 = (Elf64_Sym *)outFilePath;
    if ((local_1038[0].sh_name != 0x464c457f) ||
       (uVar17 = CONCAT31((int3)((uint)iVar9 >> 8),(char)local_1038[0].sh_type) - 3,
       pcVar28 = (char *)(ulong)uVar17, (byte)uVar17 < 0xfe)) goto LAB_001ebe0c;
    if (local_1038[0].sh_type._1_1_ != '\x02') {
      local_10bb = (char)local_1038[0].sh_type == '\x01';
      bVar3 = !(bool)local_10bb;
      pEStack_10d0 = (Elf32_Shdr *)0x1ebad0;
      T_FileStream_close((FileStream *)pEVar11);
      local_10ba = local_1038[0].sh_addr._2_2_;
      unaff_RBX = (Elf64_Shdr *)(ulong)((uint)bVar3 * 0x20 + 0x20);
      pcVar28 = (char *)0x0;
      pEStack_10d0 = (Elf32_Shdr *)0x1ebaf2;
      printf("genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n",
             (ulong)local_1038[0].sh_addr._2_2_,unaff_RBX);
      __dest = (Elf32_Sym *)local_10b8;
      goto LAB_001ebb25;
    }
  }
  pEStack_10d0 = (Elf32_Shdr *)0x1ebe19;
  writeObjectCode_cold_1();
  pcStack_1108 = local_10a0;
  cVar6 = (char)local_10a8;
  cVar5 = (char)local_10b0;
  uVar19 = (Elf32_Word)local_10b8;
  pcStack_1128 = (char *)CONCAT26(local_10ba,CONCAT15(local_10bb,uStack_10c0));
  UStack_114c = U_ZERO_ERROR;
  code = 0x200;
  pcStack_1118 = pcVar26;
  pEStack_10f8 = unaff_RBX;
  pFStack_10f0 = (FileStream *)optEntryPoint;
  pEStack_10e8 = (Elf64_Sym *)outFilePath;
  pEStack_10e0 = unaff_R14;
  pEStack_10d8 = (Elf64_Shdr *)optMatchArch;
  pEStack_10d0 = (Elf32_Shdr *)filename;
  pEStack_1148 = (Elf64_Shdr *)uprv_malloc_63(0x200);
  pEVar11 = extraout_RDX;
  if (pEStack_1148 != (Elf64_Shdr *)0x0) {
    maxSize = uVar19;
    if (pEVar14 == (Elf64_Shdr *)0x0) {
      pEVar14 = (Elf64_Shdr *)u_getDataDirectory_63();
    }
    pEVar11 = (Elf64_Shdr *)"icudt63l";
    if (pEVar23 != (Elf64_Shdr *)0x0) {
      pEVar11 = pEVar23;
    }
    pEStack_1120 = (Elf64_Shdr *)0x326442;
    if ((Elf64_Shdr *)pcVar28 != (Elf64_Shdr *)0x0) {
      pEStack_1120 = (Elf64_Shdr *)pcVar28;
    }
    pcStack_1100 = ".";
    if (optFilename != (char *)0x0) {
      pcStack_1100 = optFilename;
    }
    pEStack_1130 = pEVar14;
    if (pcStack_1128 != (char *)0x0) {
      pEVar23 = (Elf64_Shdr *)T_FileStream_open(pcStack_1128,"r");
      if (pEVar23 != (Elf64_Shdr *)0x0) goto LAB_001ebf14;
      createCommonDataFile_cold_1();
    }
    pEVar23 = (Elf64_Shdr *)T_FileStream_stdin();
LAB_001ebf14:
    pEStack_1110 = extraout_RDX;
    if (cVar6 != '\0') {
      pcVar26 = "generating %s_%s.c (table of contents source file)\n";
      if (cVar5 == '\0') {
        pcVar26 = "generating %s.%s (common data file with table of contents)\n";
      }
      printf(pcVar26,pEVar11,pEStack_1120);
    }
    pcVar28 = (char *)0x0;
    pEVar14 = pEStack_1148;
    pEVar16 = extraout_RDX;
    pEStack_1140 = pEVar23;
    pEStack_1138 = pEVar11;
LAB_001ebf58:
    if (((Elf64_Shdr *)pcVar28 != (Elf64_Shdr *)0x0) &&
       (pathname = (Elf64_Shdr *)pcVar28, *(char *)&((Elf64_Shdr *)pcVar28)->sh_name != '\0')) {
LAB_001ebf89:
      do {
        bVar1 = *(byte *)&((Elf64_Shdr *)pcVar28)->sh_name;
        if (bVar1 < 0xd) {
          if (bVar1 == 0) goto LAB_001ebfb9;
          if (bVar1 == 10) goto LAB_001ebfac;
        }
        else {
          if (bVar1 == 0xd) goto LAB_001ebfac;
          if (bVar1 == 0x20) {
            *(char *)&((Elf64_Shdr *)pcVar28)->sh_name = '\0';
            pcVar28 = (char *)((long)&((Elf64_Shdr *)pcVar28)->sh_name + 1);
            goto LAB_001ebfb9;
          }
        }
        pcVar28 = (char *)((long)&((Elf64_Shdr *)pcVar28)->sh_name + 1);
      } while( true );
    }
    pathname = (Elf64_Shdr *)T_FileStream_readLine((FileStream *)pEVar23,(char *)pEVar14,0x200);
    if (pathname != (Elf64_Shdr *)0x0) {
      pcVar28 = (char *)pathname;
      if (*(char *)&pathname->sh_name == '\0') {
        pcVar28 = (char *)pEVar14;
        pathname = pEVar14;
      }
      goto LAB_001ebf89;
    }
    uprv_free_63(pEVar14);
    pEVar11 = (Elf64_Shdr *)T_FileStream_stdin();
    if (pEVar23 != pEVar11) {
      T_FileStream_close((FileStream *)pEVar23);
    }
    pEVar11 = pEStack_1120;
    pEVar23 = pEStack_1138;
    if ((ulong)fileCount == 0) {
      pcVar26 = "<stdin>";
      if (pcStack_1128 != (char *)0x0) {
        pcVar26 = pcStack_1128;
      }
      fprintf(_stderr,"gencmn: no files listed in %s\n",pcVar26);
      return;
    }
    qsort(files,(ulong)fileCount,0x20,compareFiles);
    pEVar14 = pEStack_1130;
    pFVar4 = files;
    if (cVar5 == '\0') {
      uVar22 = (ulong)fileCount;
      if (uVar22 != 0) {
        iVar10 = fileCount * 8 + 4;
        uVar17 = basenameTotal + fileCount * 8 + 0x13 & 0xfffffff0;
        lVar18 = 0;
        do {
          *(uint *)((long)&pFVar4->fileOffset + lVar18) = uVar17;
          uVar17 = uVar17 + (*(int *)((long)&pFVar4->fileSize + lVar18) + 0xfU & 0xfffffff0);
          *(int *)((long)&pFVar4->basenameOffset + lVar18) = iVar10;
          iVar10 = iVar10 + *(int *)((long)&pFVar4->basenameLength + lVar18);
          lVar18 = lVar18 + 0x20;
        } while (uVar22 << 5 != lVar18);
      }
      pcVar26 = 
      " Copyright (C) 2016 and later: Unicode, Inc. and others. License & terms of use: http://www.unicode.org/copyright.html "
      ;
      if (pcStack_1118 != (char *)0x0) {
        pcVar26 = pcStack_1118;
      }
      pData = udata_create((char *)pEStack_1130,(char *)pEVar11,(char *)pEVar23,&dataInfo,pcVar26,
                           &UStack_114c);
      code = UStack_114c;
      if (U_ZERO_ERROR < UStack_114c) goto LAB_001ec833;
      udata_write32(pData,fileCount);
      if (fileCount == 0) {
LAB_001ec77a:
        uVar17 = basenameTotal + 4;
LAB_001ec783:
        if ((uVar17 & 0xf) != 0) {
          udata_writePadding(pData,0x10 - (uVar17 & 0xf));
        }
        udata_finish(pData,&UStack_114c);
        uVar22 = (ulong)(uint)UStack_114c;
        if (U_ZERO_ERROR < UStack_114c) {
          pUVar24 = &UStack_114c;
          createCommonDataFile_cold_9();
          strcmp(*(char **)(uVar22 + 8),*(char **)(pUVar24 + 2));
          return;
        }
        return;
      }
      lVar18 = 0;
      uVar22 = 0;
      do {
        udata_write32(pData,*(uint32_t *)((long)&files->basenameOffset + lVar18));
        udata_write32(pData,*(uint32_t *)((long)&files->fileOffset + lVar18));
        uVar22 = uVar22 + 1;
        lVar18 = lVar18 + 0x20;
      } while (uVar22 < fileCount);
      if (fileCount == 0) goto LAB_001ec77a;
      lVar18 = 0x10;
      uVar22 = 0;
      do {
        udata_writeString(pData,*(char **)((long)files + lVar18 + -8),
                          *(int32_t *)((long)&files->pathname + lVar18));
        uVar22 = uVar22 + 1;
        lVar18 = lVar18 + 0x20;
      } while (uVar22 < fileCount);
      uVar17 = basenameTotal + fileCount * 8 + 4;
      if (fileCount == 0) goto LAB_001ec783;
      pcVar28 = createCommonDataFile::buffer;
      pEVar23 = (Elf64_Shdr *)0x0;
      pEVar16 = pEVar11;
      while( true ) {
        if ((uVar17 & 0xf) != 0) {
          udata_writePadding(pData,0x10 - (uVar17 & 0xf));
        }
        if (cVar6 != '\0') {
          pcVar26 = "s";
          if ((ulong)files[(long)pEVar23].fileSize == 1) {
            pcVar26 = "";
          }
          printf("adding %s (%ld byte%s)\n",files[(long)pEVar23].pathname,
                 (ulong)files[(long)pEVar23].fileSize,pcVar26);
        }
        iVar10 = (int)pEVar23 * 0x20;
        pEVar11 = (Elf64_Shdr *)T_FileStream_open(files[(long)pEVar23].pathname,"rb");
        pEVar14 = pEVar23;
        if (pEVar11 == (Elf64_Shdr *)0x0) goto LAB_001ec817;
        length = T_FileStream_read((FileStream *)pEVar11,createCommonDataFile::buffer,0x1000);
        uVar17 = 0;
        while (length != 0) {
          uVar17 = uVar17 + length;
          udata_writeBlock(pData,createCommonDataFile::buffer,length);
          length = T_FileStream_read((FileStream *)pEVar11,createCommonDataFile::buffer,0x1000);
        }
        T_FileStream_close((FileStream *)pEVar11);
        pEVar16 = (Elf64_Shdr *)files;
        if (uVar17 != files[(long)pEVar23].fileSize) break;
        uVar27 = (int)pEVar23 + 1;
        pEVar23 = (Elf64_Shdr *)(ulong)uVar27;
        pEVar16 = pEVar11;
        if (fileCount <= uVar27) goto LAB_001ec783;
      }
      goto LAB_001ec81f;
    }
    strcpy(createCommonDataFile::buffer,(char *)pEStack_1130);
    sVar12 = strlen(createCommonDataFile::buffer);
    pcVar26 = createCommonDataFile::buffer + sVar12;
    if ((0 < (long)sVar12) && ((&DAT_0040514f)[sVar12] != '/')) {
      *pcVar26 = '/';
      pcVar26 = createCommonDataFile::buffer + sVar12 + 1;
    }
    strcpy(pcVar26,(char *)pEVar23);
    if (*(char *)&pEVar11->sh_name != '\0') {
      sVar12 = strlen(pcVar26);
      pcVar20 = pcVar26 + sVar12;
      pcVar26 = pcVar20 + 1;
      *pcVar20 = '_';
      strcpy(pcVar26,(char *)pEVar11);
    }
    sVar12 = strlen(pcVar26);
    (pcVar26 + sVar12)[0] = '.';
    (pcVar26 + sVar12)[1] = 'c';
    pcVar26[sVar12 + 2] = '\0';
    pFVar13 = T_FileStream_open(createCommonDataFile::buffer,"w");
    pcVar26 = pcStack_1108;
    if (pcStack_1108 != (char *)0x0) {
      strcpy(pcStack_1108,createCommonDataFile::buffer);
    }
    code = (UErrorCode)pcVar26;
    pEVar14 = (Elf64_Shdr *)pcVar28;
    if (pFVar13 != (FileStream *)0x0) {
      sprintf(createCommonDataFile::buffer,
              "/*\n * ICU common data table of contents for %s.%s\n * Automatically generated by icu/source/tools/gencmn/gencmn .\n */\n\n#include \"unicode/utypes.h\"\n#include \"unicode/udata.h\"\n\n/* external symbol declarations for data (%d files) */\n"
              ,pEVar23,pEVar11,(ulong)fileCount);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      sprintf(createCommonDataFile::buffer,"extern const char\n    %s%s[]","",files->pathname);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      if (1 < fileCount) {
        uVar22 = 1;
        lVar18 = 0x20;
        do {
          sprintf(createCommonDataFile::buffer,",\n    %s%s[]","",
                  *(undefined8 *)((long)&files->pathname + lVar18));
          T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
          uVar22 = uVar22 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < fileCount);
      }
      T_FileStream_writeLine(pFVar13,";\n\n");
      sprintf(createCommonDataFile::buffer,
              "U_EXPORT struct {\n    uint16_t headerSize;\n    uint8_t magic1, magic2;\n    UDataInfo info;\n    char padding[%lu];\n    uint32_t count, reserved;\n    struct {\n        const char *name;\n        const void *data;\n    } toc[%lu];\n} U_EXPORT2 %s_dat = {\n    32, 0xda, 0x27, {\n        %lu, 0,\n        %u, %u, %u, 0,\n        {0x54, 0x6f, 0x43, 0x50},\n        {1, 0, 0, 0},\n        {0, 0, 0, 0}\n    },\n    \"\", %lu, 0, {\n"
              ,8,(ulong)fileCount,pEStack_1110,0x14,0,0,2,(ulong)fileCount);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      sprintf(createCommonDataFile::buffer,"        { \"%s\", %s%s }",files->basename,"",
              files->pathname);
      T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
      if (1 < fileCount) {
        uVar22 = 1;
        lVar18 = 0x28;
        do {
          sprintf(createCommonDataFile::buffer,",\n        { \"%s\", %s%s }",
                  *(undefined8 *)((long)&files->pathname + lVar18),"",
                  *(undefined8 *)((long)files + lVar18 + -8));
          T_FileStream_writeLine(pFVar13,createCommonDataFile::buffer);
          uVar22 = uVar22 + 1;
          lVar18 = lVar18 + 0x20;
        } while (uVar22 < fileCount);
      }
      T_FileStream_writeLine(pFVar13,"\n    }\n};\n");
      T_FileStream_close(pFVar13);
      uprv_free_63((void *)0x0);
      return;
    }
    goto LAB_001ec82e;
  }
  goto LAB_001ec829;
LAB_001ebfac:
  *(char *)&((Elf64_Shdr *)pcVar28)->sh_name = '\0';
LAB_001ebfb9:
  if (*(char *)&pathname->sh_name == '#') goto LAB_001ebf58;
  pEVar14 = (Elf64_Shdr *)getLongPathname((char *)pathname);
  if (fileCount == fileMax) {
    fileMax = fileCount + 0x100;
    files = (File *)uprv_realloc_63(files,(ulong)fileMax << 5);
    if (files != (File *)0x0) goto LAB_001ec000;
    createCommonDataFile_cold_5();
  }
  else {
LAB_001ec000:
    if (cVar5 != '\0') {
      sVar12 = strlen((char *)pEVar14);
      pEVar23 = pEStack_1138;
      sVar15 = strlen((char *)pEStack_1138);
      pEVar11 = (Elf64_Shdr *)(sVar12 + sVar15 + 1);
      uVar19 = (int)(sVar12 + sVar15) + 2;
      pEVar16 = (Elf64_Shdr *)allocString(uVar19);
      strcpy((char *)pEVar16,(char *)pEVar23);
      sVar12 = strlen((char *)pEVar16);
      *(undefined2 *)((long)&pEVar16->sh_name + sVar12) = 0x2f;
      strcat((char *)pEVar16,(char *)pEVar14);
      files[fileCount].basename = (char *)pEVar16;
      pcVar26 = allocString(uVar19);
      files[fileCount].pathname = pcVar26;
      if ((int)pEVar11 != 0) {
        lVar18 = 0;
        do {
          cVar2 = *(char *)((long)&pEVar16->sh_name + lVar18);
          cVar25 = '_';
          if (2 < (byte)(cVar2 - 0x2dU)) {
            cVar25 = cVar2;
          }
          pcVar26[lVar18] = cVar25;
          lVar18 = lVar18 + 1;
        } while ((int)pEVar11 != (int)lVar18);
        pcVar26 = pcVar26 + lVar18;
      }
      *pcVar26 = '\0';
      pEVar23 = pEStack_1140;
LAB_001ec268:
      fileCount = fileCount + 1;
      pEVar14 = pEStack_1148;
      goto LAB_001ebf58;
    }
    UVar8 = uprv_pathIsAbsolute_63((char *)pEVar14);
    if (UVar8 == '\0') {
      sVar12 = strlen((char *)pEVar14);
      pcVar26 = pcStack_1100;
      sVar15 = strlen(pcStack_1100);
      pEVar16 = (Elf64_Shdr *)uprv_malloc_63((long)((int)sVar15 + (int)sVar12 + 2));
      strcpy((char *)pEVar16,pcVar26);
      sVar12 = strlen((char *)pEVar16);
      *(undefined2 *)((long)&pEVar16->sh_name + sVar12) = 0x2f;
      sVar12 = strlen((char *)pEVar16);
      *(undefined1 *)((long)&pEVar16->sh_name + (long)(int)sVar12) = 0;
      strcat((char *)pEVar16,(char *)pEVar14);
      sVar12 = strlen((char *)pEVar14);
      pEVar23 = pEStack_1138;
      sVar15 = strlen((char *)pEStack_1138);
      uVar19 = (int)sVar12 + (int)sVar15 + 2;
      pEVar11 = (Elf64_Shdr *)allocString(uVar19);
      strcpy((char *)pEVar11,(char *)pEVar23);
      sVar12 = strlen((char *)pEVar11);
      *(undefined2 *)((long)&pEVar11->sh_name + sVar12) = 0x2f;
      strcat((char *)pEVar11,(char *)pEVar14);
      pFVar4 = files;
      uVar22 = (ulong)fileCount;
      files[uVar22].basename = (char *)pEVar11;
      pFVar4[uVar22].basenameLength = uVar19;
      pFVar4[uVar22].pathname = (char *)pEVar16;
      basenameTotal = basenameTotal + uVar19;
      pFVar13 = T_FileStream_open((char *)pEVar16,"rb");
      if (pFVar13 == (FileStream *)0x0) goto LAB_001ec80f;
      uVar17 = T_FileStream_size(pFVar13);
      pEVar14 = (Elf64_Shdr *)(ulong)uVar17;
      iVar10 = T_FileStream_error(pFVar13);
      pEVar23 = pEStack_1140;
      if ((iVar10 != 0) || (uVar17 < 0x15)) goto LAB_001ec807;
      T_FileStream_close(pFVar13);
      pEVar14 = pEStack_1148;
      if ((maxSize != 0) && (maxSize < uVar17)) {
        if (cVar6 != '\0') {
          printf("%s ignored (size %ld > %ld)\n",pEVar16,(ulong)uVar17);
        }
        goto LAB_001ebf58;
      }
      files[fileCount].fileSize = uVar17;
      goto LAB_001ec268;
    }
  }
  createCommonDataFile_cold_2();
LAB_001ec807:
  createCommonDataFile_cold_3();
LAB_001ec80f:
  iVar10 = (int)pEVar11;
  createCommonDataFile_cold_4();
LAB_001ec817:
  pEVar11 = pEVar16;
  createCommonDataFile_cold_8();
  pEVar16 = pEVar23;
  pEVar23 = pEVar14;
LAB_001ec81f:
  code = (int)pEVar16 + iVar10;
  createCommonDataFile_cold_7();
LAB_001ec829:
  createCommonDataFile_cold_10();
  pEVar14 = (Elf64_Shdr *)pcVar28;
LAB_001ec82e:
  createCommonDataFile_cold_6();
LAB_001ec833:
  __stream = _stderr;
  pcVar26 = u_errorName_63(code);
  fprintf(__stream,"gencmn: udata_create(-d %s -n %s -t %s) failed - %s\n",pEVar14,pEVar23,pEVar11,
          pcVar26);
  exit(UStack_114c);
}

Assistant:

U_CAPI void U_EXPORT2
writeObjectCode(const char *filename, const char *destdir, const char *optEntryPoint, const char *optMatchArch, const char *optFilename, char *outFilePath) {
    /* common variables */
    char buffer[4096], entry[96]={ 0 };
    FileStream *in, *out;
    const char *newSuffix;
    int32_t i, entryLength, length, size, entryOffset=0, entryLengthOffset=0;

    uint16_t cpu, bits;
    UBool makeBigEndian;

    /* platform-specific variables and initialization code */
#ifdef U_ELF
    /* 32-bit Elf file header */
    static Elf32_Ehdr header32={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS32,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_386,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf32_Off)sizeof(Elf32_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf32_Half)sizeof(Elf32_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf32_Half)sizeof(Elf32_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 32-bit Elf section header table */
    static Elf32_Shdr sectionHeaders32[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)), /* sh_offset */
            (Elf32_Word)(2*sizeof(Elf32_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf32_Word)(sizeof(Elf32_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40), /* sh_offset */
            (Elf32_Word)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf32_Off)(sizeof(header32)+sizeof(sectionHeaders32)+2*sizeof(Elf32_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /* symbol table */
    static Elf32_Sym symbols32[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            0, /* st_value */
            0, /* st_size */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4 /* st_shndx=index of related section table entry */
        }
    };

    /* section header string table, with decimal string offsets */
    static const char sectionStrings[40]=
        /*  0 */ "\0"
        /*  1 */ ".symtab\0"
        /*  9 */ ".shstrtab\0"
        /* 19 */ ".strtab\0"
        /* 27 */ ".rodata\0"
        /* 35 */ "\0\0\0\0"; /* contains terminating NUL */
        /* 40: padded to multiple of 8 bytes */

    /*
     * Use entry[] for the string table which will contain only the
     * entry point name.
     * entry[0] must be 0 (NUL)
     * The entry point name can be up to 38 characters long (sizeof(entry)-2).
     */

    /* 16-align .rodata in the .o file, just in case */
    static const char padding[16]={ 0 };
    int32_t paddingSize;

#ifdef U_ELF64
    /* 64-bit Elf file header */
    static Elf64_Ehdr header64={
        {
            /* e_ident[] */
            ELFMAG0, ELFMAG1, ELFMAG2, ELFMAG3,
            ELFCLASS64,
            U_IS_BIG_ENDIAN ? ELFDATA2MSB : ELFDATA2LSB,
            EV_CURRENT /* EI_VERSION */
        },
        ET_REL,
        EM_X86_64,
        EV_CURRENT, /* e_version */
        0, /* e_entry */
        0, /* e_phoff */
        (Elf64_Off)sizeof(Elf64_Ehdr), /* e_shoff */
        0, /* e_flags */
        (Elf64_Half)sizeof(Elf64_Ehdr), /* eh_size */
        0, /* e_phentsize */
        0, /* e_phnum */
        (Elf64_Half)sizeof(Elf64_Shdr), /* e_shentsize */
        5, /* e_shnum */
        2 /* e_shstrndx */
    };

    /* 64-bit Elf section header table */
    static Elf64_Shdr sectionHeaders64[5]={
        { /* SHN_UNDEF */
            0, 0, 0, 0, 0, 0, 0, 0, 0, 0
        },
        { /* .symtab */
            1, /* sh_name */
            SHT_SYMTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)), /* sh_offset */
            (Elf64_Xword)(2*sizeof(Elf64_Sym)), /* sh_size */
            3, /* sh_link=sect hdr index of .strtab */
            1, /* sh_info=One greater than the symbol table index of the last
                * local symbol (with STB_LOCAL). */
            4, /* sh_addralign */
            (Elf64_Xword)(sizeof(Elf64_Sym)) /* sh_entsize */
        },
        { /* .shstrtab */
            9, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)), /* sh_offset */
            40, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .strtab */
            19, /* sh_name */
            SHT_STRTAB,
            0, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40), /* sh_offset */
            (Elf64_Xword)sizeof(entry), /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            1, /* sh_addralign */
            0 /* sh_entsize */
        },
        { /* .rodata */
            27, /* sh_name */
            SHT_PROGBITS,
            SHF_ALLOC, /* sh_flags */
            0, /* sh_addr */
            (Elf64_Off)(sizeof(header64)+sizeof(sectionHeaders64)+2*sizeof(Elf64_Sym)+40+sizeof(entry)), /* sh_offset */
            0, /* sh_size */
            0, /* sh_link */
            0, /* sh_info */
            16, /* sh_addralign */
            0 /* sh_entsize */
        }
    };

    /*
     * 64-bit symbol table
     * careful: different order of items compared with Elf32_sym!
     */
    static Elf64_Sym symbols64[2]={
        { /* STN_UNDEF */
            0, 0, 0, 0, 0, 0
        },
        { /* data entry point */
            1, /* st_name */
            ELF64_ST_INFO(STB_GLOBAL, STT_OBJECT),
            0, /* st_other */
            4, /* st_shndx=index of related section table entry */
            0, /* st_value */
            0 /* st_size */
        }
    };

#endif /* U_ELF64 */

    /* entry[] have a leading NUL */
    entryOffset=1;

    /* in the common code, count entryLength from after the NUL */
    entryLengthOffset=1;

    newSuffix=".o";

#elif U_PLATFORM_HAS_WIN32_API
    struct {
        IMAGE_FILE_HEADER fileHeader;
        IMAGE_SECTION_HEADER sections[2];
        char linkerOptions[100];
    } objHeader;
    IMAGE_SYMBOL symbols[1];
    struct {
        DWORD sizeofLongNames;
        char longNames[100];
    } symbolNames;

    /*
     * entry sometimes have a leading '_'
     * overwritten if entryOffset==0 depending on the target platform
     * see check for cpu below
     */
    entry[0]='_';

    newSuffix=".obj";
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* deal with options, files and the entry point name */
    getArchitecture(&cpu, &bits, &makeBigEndian, optMatchArch);
    if (optMatchArch)
    {
        printf("genccode: --match-arch cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
    else
    {
        printf("genccode: using architecture cpu=%hu bits=%hu big-endian=%d\n", cpu, bits, makeBigEndian);
    }
#if U_PLATFORM_HAS_WIN32_API
    if(cpu==IMAGE_FILE_MACHINE_I386) {
        entryOffset=1;
    }
#endif

    in=T_FileStream_open(filename, "rb");
    if(in==NULL) {
        fprintf(stderr, "genccode: unable to open input file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }
    size=T_FileStream_size(in);

    getOutFilename(filename, destdir, buffer, entry+entryOffset, newSuffix, optFilename);
    if (outFilePath != NULL) {
        uprv_strcpy(outFilePath, buffer);
    }

    if(optEntryPoint != NULL) {
        uprv_strcpy(entry+entryOffset, optEntryPoint);
        uprv_strcat(entry+entryOffset, "_dat");
    }
    /* turn dashes in the entry name into underscores */
    entryLength=(int32_t)uprv_strlen(entry+entryLengthOffset);
    for(i=0; i<entryLength; ++i) {
        if(entry[entryLengthOffset+i]=='-') {
            entry[entryLengthOffset+i]='_';
        }
    }

    /* open the output file */
    out=T_FileStream_open(buffer, "wb");
    if(out==NULL) {
        fprintf(stderr, "genccode: unable to open output file %s\n", buffer);
        exit(U_FILE_ACCESS_ERROR);
    }

#ifdef U_ELF
    if(bits==32) {
        header32.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header32.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders32[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders32[4].sh_offset+=paddingSize;
        }

        sectionHeaders32[4].sh_size=(Elf32_Word)size;

        symbols32[1].st_size=(Elf32_Word)size;

        /* write .o headers */
        T_FileStream_write(out, &header32, (int32_t)sizeof(header32));
        T_FileStream_write(out, sectionHeaders32, (int32_t)sizeof(sectionHeaders32));
        T_FileStream_write(out, symbols32, (int32_t)sizeof(symbols32));
    } else /* bits==64 */ {
#ifdef U_ELF64
        header64.e_ident[EI_DATA]= makeBigEndian ? ELFDATA2MSB : ELFDATA2LSB;
        header64.e_machine=cpu;

        /* 16-align .rodata in the .o file, just in case */
        paddingSize=sectionHeaders64[4].sh_offset & 0xf;
        if(paddingSize!=0) {
                paddingSize=0x10-paddingSize;
                sectionHeaders64[4].sh_offset+=paddingSize;
        }

        sectionHeaders64[4].sh_size=(Elf64_Xword)size;

        symbols64[1].st_size=(Elf64_Xword)size;

        /* write .o headers */
        T_FileStream_write(out, &header64, (int32_t)sizeof(header64));
        T_FileStream_write(out, sectionHeaders64, (int32_t)sizeof(sectionHeaders64));
        T_FileStream_write(out, symbols64, (int32_t)sizeof(symbols64));
#endif
    }

    T_FileStream_write(out, sectionStrings, (int32_t)sizeof(sectionStrings));
    T_FileStream_write(out, entry, (int32_t)sizeof(entry));
    if(paddingSize!=0) {
        T_FileStream_write(out, padding, paddingSize);
    }
#elif U_PLATFORM_HAS_WIN32_API
    /* populate the .obj headers */
    uprv_memset(&objHeader, 0, sizeof(objHeader));
    uprv_memset(&symbols, 0, sizeof(symbols));
    uprv_memset(&symbolNames, 0, sizeof(symbolNames));

    /* write the linker export directive */
    uprv_strcpy(objHeader.linkerOptions, "-export:");
    length=8;
    uprv_strcpy(objHeader.linkerOptions+length, entry);
    length+=entryLength;
    uprv_strcpy(objHeader.linkerOptions+length, ",data ");
    length+=6;

    /* set the file header */
    objHeader.fileHeader.Machine=cpu;
    objHeader.fileHeader.NumberOfSections=2;
    objHeader.fileHeader.TimeDateStamp=(DWORD)time(NULL);
    objHeader.fileHeader.PointerToSymbolTable=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length+size; /* start of symbol table */
    objHeader.fileHeader.NumberOfSymbols=1;

    /* set the section for the linker options */
    uprv_strncpy((char *)objHeader.sections[0].Name, ".drectve", 8);
    objHeader.sections[0].SizeOfRawData=length;
    objHeader.sections[0].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER;
    objHeader.sections[0].Characteristics=IMAGE_SCN_LNK_INFO|IMAGE_SCN_LNK_REMOVE|IMAGE_SCN_ALIGN_1BYTES;

    /* set the data section */
    uprv_strncpy((char *)objHeader.sections[1].Name, ".rdata", 6);
    objHeader.sections[1].SizeOfRawData=size;
    objHeader.sections[1].PointerToRawData=IMAGE_SIZEOF_FILE_HEADER+2*IMAGE_SIZEOF_SECTION_HEADER+length;
    objHeader.sections[1].Characteristics=IMAGE_SCN_CNT_INITIALIZED_DATA|IMAGE_SCN_ALIGN_16BYTES|IMAGE_SCN_MEM_READ;

    /* set the symbol table */
    if(entryLength<=8) {
        uprv_strncpy((char *)symbols[0].N.ShortName, entry, entryLength);
        symbolNames.sizeofLongNames=4;
    } else {
        symbols[0].N.Name.Short=0;
        symbols[0].N.Name.Long=4;
        symbolNames.sizeofLongNames=4+entryLength+1;
        uprv_strcpy(symbolNames.longNames, entry);
    }
    symbols[0].SectionNumber=2;
    symbols[0].StorageClass=IMAGE_SYM_CLASS_EXTERNAL;

    /* write the file header and the linker options section */
    T_FileStream_write(out, &objHeader, objHeader.sections[1].PointerToRawData);
#else
#   error "Unknown platform for CAN_GENERATE_OBJECTS."
#endif

    /* copy the data file into section 2 */
    for(;;) {
        length=T_FileStream_read(in, buffer, sizeof(buffer));
        if(length==0) {
            break;
        }
        T_FileStream_write(out, buffer, (int32_t)length);
    }

#if U_PLATFORM_HAS_WIN32_API
    /* write the symbol table */
    T_FileStream_write(out, symbols, IMAGE_SIZEOF_SYMBOL);
    T_FileStream_write(out, &symbolNames, symbolNames.sizeofLongNames);
#endif

    if(T_FileStream_error(in)) {
        fprintf(stderr, "genccode: file read error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    if(T_FileStream_error(out)) {
        fprintf(stderr, "genccode: file write error while generating from file %s\n", filename);
        exit(U_FILE_ACCESS_ERROR);
    }

    T_FileStream_close(out);
    T_FileStream_close(in);
}